

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_3chan_interleave(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  exr_coding_channel_info_t *peVar6;
  uint8_t *puVar7;
  int x;
  ulong uVar8;
  int y;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint16_t *out;
  long lVar14;
  uint8_t *puVar15;
  
  pvVar5 = decode->unpacked_buffer;
  peVar6 = decode->channels;
  uVar1 = peVar6->width;
  iVar2 = (decode->chunk).height;
  iVar3 = decode->user_line_end_ignore;
  iVar4 = peVar6->user_line_stride;
  puVar7 = (peVar6->field_12).decode_to_ptr;
  iVar9 = decode->user_line_begin_skip;
  lVar10 = (long)(int)(uVar1 * 6);
  lVar14 = (long)(int)(uVar1 * 6 * iVar9);
  lVar11 = (long)pvVar5 + lVar14;
  uVar12 = 0;
  if (0 < (int)uVar1) {
    uVar12 = (ulong)uVar1;
  }
  lVar13 = lVar14 + (long)(int)uVar1 * 4 + (long)pvVar5;
  lVar14 = lVar14 + (long)(int)uVar1 * 2 + (long)pvVar5;
  for (; iVar9 < iVar2 - iVar3; iVar9 = iVar9 + 1) {
    puVar15 = puVar7;
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      *(undefined2 *)puVar15 = *(undefined2 *)(lVar11 + uVar8 * 2);
      *(undefined2 *)(puVar15 + 2) = *(undefined2 *)(lVar14 + uVar8 * 2);
      *(undefined2 *)(puVar15 + 4) = *(undefined2 *)(lVar13 + uVar8 * 2);
      puVar15 = puVar15 + 6;
    }
    lVar11 = lVar11 + lVar10;
    puVar7 = puVar7 + iVar4;
    lVar13 = lVar13 + lVar10;
    lVar14 = lVar14 + lVar10;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in0[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in2[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}